

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

QTextStream * CPP::operator<<(QTextStream *str,iconFromThemeStringLiteral *i)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)QTextStream::operator<<(str,"QIcon");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"fromTheme(");
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  language::_formatString(pQVar1,&i->m_theme,&local_48,true);
  QTextStream::operator<<(pQVar1,')');
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return str;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &operator<<(QTextStream &str, const iconFromThemeStringLiteral &i)
{
    str << "QIcon" << language::qualifier << "fromTheme(" << language::qstring(i.m_theme) << ')';
    return str;
}